

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TestFunctionWrapper::call
          (TestFunctionWrapper *this,DebugMessageTestContext *ctx)

{
  DebugMessageTestContext *ctx_local;
  TestFunctionWrapper *this_local;
  
  if (this->m_type == TYPE_CORE) {
    (*(this->m_func).coreFn)(&ctx->super_NegativeTestContext);
  }
  else if (this->m_type == TYPE_DEBUG) {
    (*(this->m_func).coreFn)(&ctx->super_NegativeTestContext);
  }
  return;
}

Assistant:

void TestFunctionWrapper::call (DebugMessageTestContext& ctx) const
{
	if (m_type == TYPE_CORE)
		m_func.coreFn(static_cast<NegativeTestContext&>(ctx));
	else if (m_type == TYPE_DEBUG)
		m_func.debugFn(ctx);
	else
		DE_ASSERT(false);
}